

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_manager.cpp
# Opt level: O3

void __thiscall
cfdcore_manager_Initialize_Test::~cfdcore_manager_Initialize_Test
          (cfdcore_manager_Initialize_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(cfdcore_manager, Initialize) {
  // 確保したハンドルはプロセス終了時に自動解放させる
  CfdCoreHandle  handle_ = nullptr;
  EXPECT_NO_THROW((Initialize(&handle_)));
  // error
  CfdCoreHandle* p_handle = nullptr;
  EXPECT_THROW((Initialize(p_handle)), CfdException);
}